

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::VectorTest_NotDefaultConstructible_Test::TestBody
          (VectorTest_NotDefaultConstructible_Test *this)

{
  NotDefaultConstructible *pNVar1;
  size_t sVar2;
  bool bVar3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Vector<NotDefaultConstructible> vec;
  AssertHelper local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  AssertHelper local_80;
  Vector<NotDefaultConstructible> local_78;
  NotDefaultConstructible local_58;
  NotDefaultConstructible local_48;
  NotDefaultConstructible local_38;
  NotDefaultConstructible local_28;
  
  local_78.data_ = (NotDefaultConstructible *)0x0;
  local_78.size_ = 0;
  local_78.capacity_ = 0;
  TestBody::NotDefaultConstructible::NotDefaultConstructible(&local_28,0);
  bVar3 = Vector<NotDefaultConstructible>::Push(&local_78,&local_28);
  local_b0._M_head_impl._0_1_ = (internal)bVar3;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  OPENSSL_free(local_28.array.data_);
  local_28.array.data_ = (int *)0x0;
  local_28.array.size_ = 0;
  if (local_b0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_b0,
               (AssertionResult *)"vec.Push(NotDefaultConstructible(0))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x9c,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
LAB_00327f16:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_a8;
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))();
    }
    local_98 = local_a8;
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00327f5c;
  }
  else {
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    TestBody::NotDefaultConstructible::NotDefaultConstructible(&local_38,1);
    bVar3 = Vector<NotDefaultConstructible>::Push(&local_78,&local_38);
    local_b0._M_head_impl._0_1_ = (internal)bVar3;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    OPENSSL_free(local_38.array.data_);
    local_38.array.data_ = (int *)0x0;
    local_38.array.size_ = 0;
    if (local_b0._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)&local_b0,
                 (AssertionResult *)"vec.Push(NotDefaultConstructible(1))","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x9d,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
      goto LAB_00327f16;
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    TestBody::NotDefaultConstructible::NotDefaultConstructible(&local_48,2);
    bVar3 = Vector<NotDefaultConstructible>::Push(&local_78,&local_48);
    local_b0._M_head_impl._0_1_ = (internal)bVar3;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    OPENSSL_free(local_48.array.data_);
    local_48.array.data_ = (int *)0x0;
    local_48.array.size_ = 0;
    if (local_b0._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)&local_b0,
                 (AssertionResult *)"vec.Push(NotDefaultConstructible(2))","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x9e,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
      goto LAB_00327f16;
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    TestBody::NotDefaultConstructible::NotDefaultConstructible(&local_58,3);
    bVar3 = Vector<NotDefaultConstructible>::Push(&local_78,&local_58);
    local_b0._M_head_impl._0_1_ = (internal)bVar3;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    OPENSSL_free(local_58.array.data_);
    local_58.array.data_ = (int *)0x0;
    local_58.array.size_ = 0;
    if (local_b0._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)&local_b0,
                 (AssertionResult *)"vec.Push(NotDefaultConstructible(3))","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x9f,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
      goto LAB_00327f16;
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    sVar2 = local_78.size_;
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.size_;
    local_b8.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_a0,"vec.size()","4u",(unsigned_long *)&local_b0,(uint *)&local_b8);
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_98->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0xa0,pcVar4);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    pNVar1 = local_78.data_;
    local_b8.data_._0_4_ = 0;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar2 ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_003282a0:
      abort();
    }
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((local_78.data_)->array).size_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_a0,"0u","vec[0].array.size()",(uint *)&local_b8,
               (unsigned_long *)&local_b0);
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_98->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0xa1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    local_b8.data_._0_4_ = 1;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar2 ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1)
    goto LAB_003282a0;
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         pNVar1[1].array.size_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_a0,"1u","vec[1].array.size()",(uint *)&local_b8,
               (unsigned_long *)&local_b0);
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_98->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0xa2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    sVar2 = local_78.size_;
    local_b8.data_._0_4_ = 2;
    if (local_78.size_ <
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3)
    goto LAB_003282a0;
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         pNVar1[2].array.size_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_a0,"2u","vec[2].array.size()",(uint *)&local_b8,
               (unsigned_long *)&local_b0);
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_98->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0xa3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    local_b8.data_._0_4_ = 3;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar2 ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3)
    goto LAB_003282a0;
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_78.data_[3].array.size_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_a0,"3u","vec[3].array.size()",(uint *)&local_b8,
               (unsigned_long *)&local_b0);
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_98->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0xa4,message);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
    }
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00327f5c;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_98;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_98);
LAB_00327f5c:
  Vector<NotDefaultConstructible>::clear(&local_78);
  return;
}

Assistant:

TEST(InplaceVectorTest, ComplexType) {
  InplaceVector<std::vector<int>, 4> vec_of_vecs;
  const std::vector<int> data[] = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  vec_of_vecs.CopyFrom(data);
  EXPECT_EQ(Span(vec_of_vecs), Span(data));

  vec_of_vecs.Resize(2);
  EXPECT_EQ(Span(vec_of_vecs), Span(data, 2));

  vec_of_vecs.PushBack({42});
  EXPECT_EQ(3u, vec_of_vecs.size());
  vec_of_vecs.pop_back();
  EXPECT_EQ(2u, vec_of_vecs.size());

  vec_of_vecs.Resize(4);
  EXPECT_EQ(4u, vec_of_vecs.size());
  EXPECT_EQ(vec_of_vecs[0], data[0]);
  EXPECT_EQ(vec_of_vecs[1], data[1]);
  EXPECT_TRUE(vec_of_vecs[2].empty());
  EXPECT_TRUE(vec_of_vecs[3].empty());

  // Copy-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs2 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs2.size());
  EXPECT_EQ(vec_of_vecs2[0], data[0]);
  EXPECT_EQ(vec_of_vecs2[1], data[1]);
  EXPECT_TRUE(vec_of_vecs2[2].empty());
  EXPECT_TRUE(vec_of_vecs2[3].empty());

  // Copy-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs3;
  vec_of_vecs3 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs3.size());
  EXPECT_EQ(vec_of_vecs3[0], data[0]);
  EXPECT_EQ(vec_of_vecs3[1], data[1]);
  EXPECT_TRUE(vec_of_vecs3[2].empty());
  EXPECT_TRUE(vec_of_vecs3[3].empty());

  // Move-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs4 = std::move(vec_of_vecs);
  EXPECT_EQ(4u, vec_of_vecs4.size());
  EXPECT_EQ(vec_of_vecs4[0], data[0]);
  EXPECT_EQ(vec_of_vecs4[1], data[1]);
  EXPECT_TRUE(vec_of_vecs4[2].empty());
  EXPECT_TRUE(vec_of_vecs4[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs.size());
  for (const auto &vec : vec_of_vecs) {
    EXPECT_TRUE(vec.empty());
  }

  // Move-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs5;
  vec_of_vecs5 = std::move(vec_of_vecs4);
  EXPECT_EQ(4u, vec_of_vecs5.size());
  EXPECT_EQ(vec_of_vecs5[0], data[0]);
  EXPECT_EQ(vec_of_vecs5[1], data[1]);
  EXPECT_TRUE(vec_of_vecs5[2].empty());
  EXPECT_TRUE(vec_of_vecs5[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs4.size());
  for (const auto &vec : vec_of_vecs4) {
    EXPECT_TRUE(vec.empty());
  }

  std::vector<int> v = {42};
  vec_of_vecs5.Resize(3);
  EXPECT_TRUE(vec_of_vecs5.TryPushBack(v));
  EXPECT_EQ(v, vec_of_vecs5[3]);
  EXPECT_FALSE(vec_of_vecs5.TryPushBack(v));
}